

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceTest_TestNonZeroSubMessageMapEntriesPopulatedInReflection_Test::
~NoFieldPresenceTest_TestNonZeroSubMessageMapEntriesPopulatedInReflection_Test
          (NoFieldPresenceTest_TestNonZeroSubMessageMapEntriesPopulatedInReflection_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NoFieldPresenceTest,
     TestNonZeroSubMessageMapEntriesPopulatedInReflection) {
  TestAllMapTypes message;
  const Reflection* r = message.GetReflection();
  const Descriptor* desc = message.GetDescriptor();

  const FieldDescriptor* field_map_int32_foreign_message =
      desc->FindFieldByName("map_int32_foreign_message");

  (*message.mutable_map_int32_foreign_message())[123].set_c(10101);

  // Map entries show up on reflection.
  EXPECT_EQ(1, r->FieldSize(message, field_map_int32_foreign_message));
  const google::protobuf::Message& msg_map_entry = r->GetRepeatedMessage(
      message, field_map_int32_foreign_message, /*index=*/0);

  // HasField for both key and value returns true.
  EXPECT_THAT(msg_map_entry, MapEntryHasKey());
  EXPECT_THAT(msg_map_entry, MapEntryHasValue());
  EXPECT_THAT(msg_map_entry, MapEntryListFieldsSize(2));

  // For value types that are messages, further test that the message fields
  // show up on reflection.
  EXPECT_TRUE(MapValueSubMessageHasFieldViaReflection(
      message.map_int32_foreign_message().at(123)));
}